

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O2

string * cppcms::filters::streamable::to_string<char>
                   (string *__return_storage_ptr__,ios *out,void *ptr)

{
  ostringstream oss;
  long local_198 [47];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios::copyfmt((ios *)((long)local_198 + *(long *)(local_198[0] + -0x18)));
  std::operator<<((ostream *)local_198,*ptr);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(std::ios &out,void const *ptr)
			{
				T const *object=reinterpret_cast<T const *>(ptr);
				std::ostringstream oss;
				oss.copyfmt(out);
				oss << *object;
				return oss.str();
			}